

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_compare.cpp
# Opt level: O1

ON_wString __thiscall
ON_wString::MapString
          (ON_wString *this,ON_Locale *locale,ON_StringMapType map_type,wchar_t *string,
          int element_count)

{
  uint mapped_string_capacity;
  uint uVar1;
  int iVar2;
  
  if (element_count < 0) {
    element_count = Length(string);
    if (element_count < 0) goto LAB_005c6444;
    iVar2 = 0;
  }
  else {
    iVar2 = 0;
    if (((string != (wchar_t *)0x0 && element_count != 0) &&
        (iVar2 = 0, string[(ulong)(uint)element_count - 1] == L'\0')) &&
       (iVar2 = -1, element_count != 1)) {
      iVar2 = -(uint)(string[(ulong)(uint)element_count - 2] != L'\0');
    }
  }
  mapped_string_capacity = MapString(locale,map_type,string,element_count,(wchar_t *)0x0,0);
  if (mapped_string_capacity != 0) {
    ON_wString(this);
    ReserveArray(this,(ulong)mapped_string_capacity);
    SetLength(this,(ulong)(iVar2 + mapped_string_capacity));
    uVar1 = MapString(locale,map_type,string,element_count,this->m_s,mapped_string_capacity);
    if (uVar1 == mapped_string_capacity) {
      return (ON_wString)(wchar_t *)this;
    }
    ~ON_wString(this);
  }
LAB_005c6444:
  ON_wString(this,&EmptyString);
  return (ON_wString)(wchar_t *)this;
}

Assistant:

ON_wString ON_wString::MapString(
  const class ON_Locale& locale,
  ON_StringMapType map_type,
  const wchar_t* string,
  int element_count
  )
{
  bool bMappingNullTerminator;

  if (element_count < 0)
  {
    element_count = ON_wString::Length(string);
    if ( element_count < 0 )
      return ON_wString::EmptyString;
    bMappingNullTerminator = false;
  }
  else
  {
    bMappingNullTerminator
      = element_count > 0
      && nullptr != string
      && 0 == string[element_count-1]
      && (1 == element_count || 0 != string[element_count-2])
      ;
  }

  int mapped_string_capacity = ON_wString::MapString(locale,map_type,string,element_count,nullptr,0);

  if (mapped_string_capacity > 0)
  {
    ON_wString mapped_string;

    // reserves mapped_length+1 wchar_t elements in mapped_string.m_s[]
    // and sets mapped_string.m_s[mapped_length] = 0.
    mapped_string.ReserveArray(mapped_string_capacity);

    // Set mapped_string ON_wString header length value to mapped_length.
    int mapped_string_length
      = ( bMappingNullTerminator )
      ? (mapped_string_capacity-1)
      : mapped_string_capacity;
    mapped_string.SetLength(mapped_string_length);

    int rc = ON_wString::MapString(locale,map_type,string,element_count,mapped_string.m_s,mapped_string_capacity);
    if ( rc == mapped_string_capacity )
      return mapped_string;
  }

  return ON_wString::EmptyString;
}